

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coolprop_tracer.h
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
VLEIsolineTracer<double>::get_pcvec
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          VLEIsolineTracer<double> *this)

{
  pointer pbVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  allocator local_b1;
  double local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  (*(this->super_AbstractIsolineTracer<double>).super_AbstractODEIntegrator.
    _vptr_AbstractODEIntegrator[9])(&local_a8);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (pbVar1 = local_a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 != local_a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
    std::__cxx11::string::string(local_50,(string *)pbVar1);
    std::__cxx11::string::string(local_70,"pcrit",&local_b1);
    std::__cxx11::string::string(local_90,local_50);
    local_b0 = (double)CoolProp::Props1SI(local_70,local_90);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (__return_storage_ptr__,&local_b0);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

const std::vector<double> get_pcvec() const override {
        auto names = get_names();
        std::vector<double> pcvec;
        for (auto name : names) {
            pcvec.push_back(Props1SI("pcrit", name));
        }
        return pcvec;
    }